

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Promise<void> __thiscall kj::TaskSet::onEmpty(TaskSet *this)

{
  bool bVar1;
  Own<kj::PromiseFulfiller<void>_> *t;
  Promise<void> *pPVar2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  long in_RSI;
  Promise<void> PVar4;
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> local_60;
  undefined1 local_50 [8];
  PromiseFulfillerPair<void> paf;
  Fault local_20;
  Fault f;
  TaskSet *this_local;
  
  bVar1 = Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator==
                    ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)(in_RSI + 0x18),(void *)0x0);
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0xf7,FAILED,"emptyFulfiller == nullptr",
               "\"onEmpty() can only be called once at a time\"",
               (char (*) [44])"onEmpty() can only be called once at a time");
    _::Debug::Fault::fatal(&local_20);
  }
  bVar1 = Maybe<kj::Own<kj::TaskSet::Task>_>::operator==
                    ((Maybe<kj::Own<kj::TaskSet::Task>_> *)(in_RSI + 8),(void *)0x0);
  if (bVar1) {
    Promise<void>::Promise((Promise<void> *)this);
    pPVar3 = extraout_RDX;
  }
  else {
    newPromiseAndFulfiller<void>();
    t = mv<kj::Own<kj::PromiseFulfiller<void>>>
                  ((Own<kj::PromiseFulfiller<void>_> *)&paf.promise.super_PromiseBase.node.ptr);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&local_60,t);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)(in_RSI + 0x18),&local_60);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&local_60);
    pPVar2 = mv<kj::Promise<void>>((Promise<void> *)local_50);
    Promise<void>::Promise((Promise<void> *)this,pPVar2);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_50);
    pPVar3 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<void> TaskSet::onEmpty() {
  KJ_REQUIRE(emptyFulfiller == nullptr, "onEmpty() can only be called once at a time");

  if (tasks == nullptr) {
    return READY_NOW;
  } else {
    auto paf = newPromiseAndFulfiller<void>();
    emptyFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}